

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_>::build
          (BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_> *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Scene *pSVar10;
  GTypeMask GVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  Geometry *pGVar17;
  long *plVar18;
  PrimRef *pPVar19;
  size_t sVar20;
  NodeRef root;
  uint uVar21;
  long *plVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  BVH **ppBVar25;
  __pointer_type pBVar26;
  pointer ppTVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  BVH *pBVar31;
  double t0;
  string __str;
  PrimInfo pinfo;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [3];
  long local_88;
  long local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  pGVar17 = this->mesh;
  if (pGVar17 == (Geometry *)0x0) {
LAB_012ace6b:
    pSVar10 = this->scene;
    GVar11 = this->gtype_;
    uVar21 = (uint)GVar11;
    if ((uVar21 >> 0x14 & 1) == 0) {
      sVar20 = 0;
    }
    else {
      sVar20 = (pSVar10->world).numTriangles;
    }
    if ((uVar21 >> 0x15 & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numQuads;
    }
    if ((GVar11 & MTY_CURVE2) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar10->world).numLineSegments;
    }
    if ((GVar11 & MTY_CURVE4) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar10->world).numBezierCurves;
    }
    if ((GVar11 & MTY_POINTS) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar10->world).numPoints;
    }
    if ((uVar21 >> 0x17 & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numSubdivPatches;
    }
    if ((uVar21 >> 0x1d & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numUserGeometries;
    }
    if ((uVar21 >> 0x1e & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numInstancesCheap;
    }
    if ((int)uVar21 < 0) {
      sVar20 = sVar20 + (pSVar10->world).numInstancesExpensive;
    }
    if ((uVar21 >> 0x18 & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numInstanceArrays;
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      sVar20 = sVar20 + (pSVar10->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar20;
    if (sVar20 == 0) goto LAB_012acf8f;
    pBVar31 = this->bvh;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct((ulong)local_e8,'\x01');
    *local_e8[0] = 0x34;
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x1fb5f98);
    local_108 = &local_f8;
    plVar22 = plVar18 + 2;
    if ((long *)*plVar18 == plVar22) {
      local_f8 = *plVar22;
      lStack_f0 = plVar18[3];
    }
    else {
      local_f8 = *plVar22;
      local_108 = (long *)*plVar18;
    }
    local_100 = plVar18[1];
    *plVar18 = (long)plVar22;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    plVar18 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_c8._0_8_ = local_b8;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar23) {
      local_b8[0]._0_8_ = paVar23->_M_allocated_capacity;
      local_b8[0]._8_8_ = plVar18[3];
    }
    else {
      local_b8[0]._0_8_ = paVar23->_M_allocated_capacity;
      local_c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_c8._8_8_ = plVar18[1];
    *plVar18 = (long)paVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    bVar4 = true;
  }
  else {
    if (pGVar17->numPrimitives != this->numPreviousPrimitives) {
      pBVar31 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar31->alloc);
      ppTVar27 = (pBVar31->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pBVar31->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar27 != ppTVar5) {
        do {
          FastAllocator::ThreadLocal2::unbind(*ppTVar27,&pBVar31->alloc);
          ppTVar27 = ppTVar27 + 1;
        } while (ppTVar27 != ppTVar5);
        ppTVar27 = (pBVar31->alloc).thread_local_allocators.
                   super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pBVar31->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar27) {
          (pBVar31->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar27;
        }
      }
      LOCK();
      (pBVar31->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar31->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar31->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar31->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar31->alloc).device;
        bVar4 = (pBVar31->alloc).useUSM;
        pBVar26 = (pBVar31->alloc).usedBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar26->next;
          FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar4);
          pBVar26 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar31->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar31->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar31->alloc).device;
        bVar4 = (pBVar31->alloc).useUSM;
        pBVar26 = (pBVar31->alloc).freeBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar26->next;
          FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar4);
          pBVar26 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar31->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar16 = -8;
      do {
        LOCK();
        (pBVar31->alloc).threadBlocks[lVar16]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        LOCK();
        (pBVar31->alloc).threadBlocks[lVar16 + 8]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0);
      sVar20 = (pBVar31->alloc).primrefarray.size_alloced;
      pPVar8 = (pBVar31->alloc).primrefarray.items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar20 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar20 << 5,(pBVar31->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        pMVar9 = (pBVar31->alloc).primrefarray.alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar20 * -0x20,1);
      }
      (pBVar31->alloc).primrefarray.size_active = 0;
      (pBVar31->alloc).primrefarray.size_alloced = 0;
      (pBVar31->alloc).primrefarray.items = (PrimRef *)0x0;
      pGVar17 = this->mesh;
      if (pGVar17 == (Geometry *)0x0) goto LAB_012ace6b;
    }
    sVar20 = (size_t)pGVar17->numPrimitives;
    this->numPreviousPrimitives = pGVar17->numPrimitives;
    if (sVar20 == 0) {
LAB_012acf8f:
      sVar20 = (this->prims).size_alloced;
      pPVar8 = (this->prims).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar20 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar20 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        pMVar9 = (this->prims).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar20 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    pBVar31 = this->bvh;
    local_c8._0_8_ = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    bVar4 = false;
  }
  ppBVar25 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar31,(string *)&local_c8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (bVar4) {
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
  }
  uVar24 = (this->prims).size_alloced;
  uVar30 = uVar24;
  if ((uVar24 < sVar20) && (uVar30 = sVar20, uVar29 = uVar24, uVar24 != 0)) {
    do {
      uVar30 = uVar29 * 2 + (ulong)(uVar29 * 2 == 0);
      uVar29 = uVar30;
    } while (uVar30 < sVar20);
  }
  psVar1 = &(this->prims).size_active;
  if (sVar20 < (this->prims).size_active) {
    *psVar1 = sVar20;
  }
  prims = &this->prims;
  if (uVar24 == uVar30) {
    *psVar1 = sVar20;
    goto LAB_012ad20e;
  }
  pMVar9 = (this->prims).alloc.device;
  pPVar8 = (this->prims).items;
  uVar24 = uVar30 << 5;
  (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar24,0);
  if (uVar24 < 0x1c00000) {
    pPVar19 = (PrimRef *)alignedMalloc(uVar24,0x20);
  }
  else {
    pPVar19 = (PrimRef *)os_malloc(uVar24,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar19;
  if ((this->prims).size_active == 0) {
    sVar28 = (this->prims).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_012ad1b3;
  }
  else {
    lVar16 = 0;
    uVar24 = 0;
    do {
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar16);
      uVar13 = puVar2[1];
      uVar14 = puVar2[2];
      uVar15 = puVar2[3];
      puVar3 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar16);
      *puVar3 = *puVar2;
      puVar3[1] = uVar13;
      puVar3[2] = uVar14;
      puVar3[3] = uVar15;
      uVar24 = uVar24 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar24 < (this->prims).size_active);
    sVar28 = (this->prims).size_alloced;
LAB_012ad1b3:
    if (sVar28 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar28 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar28 != 0) {
    pMVar9 = (prims->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar28 * -0x20,1);
  }
  (this->prims).size_active = sVar20;
  (this->prims).size_alloced = uVar30;
LAB_012ad20e:
  if (this->mesh == (Geometry *)0x0) {
    avx::createPrimRefArray
              ((PrimInfo *)&local_c8.field_1,this->scene,this->gtype_,false,sVar20,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    avx::createPrimRefArray
              ((PrimInfo *)&local_c8.field_1,this->mesh,this->geomID_,sVar20,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar25)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar12 = (double)(sVar20 + 3 >> 2) * 1.2 * 224.0;
  uVar24 = (ulong)dVar12;
  sVar28 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24) +
           (sVar20 * 0x50 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar28);
  sVar20 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar20,sVar28);
  (this->settings).singleThreadThreshold = sVar20;
  local_78._8_8_ = this->bvh;
  local_78._0_8_ = &PTR_createLeaf_02196388;
  root = BVHNBuilderQuantizedVirtual<4>::BVHNBuilderV::build
                   ((BVHNBuilderV *)&local_78.field_1,&((BVH *)local_78._8_8_)->alloc,
                    &(((BVH *)local_78._8_8_)->scene->progressInterface).super_BuildProgressMonitor,
                    (this->prims).items,(PrimInfo *)&local_c8.field_1,this->settings);
  local_78._0_8_ = local_c8._0_8_;
  local_78._8_8_ = local_c8._8_8_;
  local_68._0_8_ = local_b8[0]._M_allocated_capacity;
  local_68._8_8_ = local_b8[0]._8_8_;
  local_58._0_8_ = local_c8._0_8_;
  local_58._8_8_ = local_c8._8_8_;
  local_48._0_8_ = local_b8[0]._M_allocated_capacity;
  local_48._8_8_ = local_b8[0]._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,local_80 - local_88);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar20 = (this->prims).size_alloced;
    pPVar8 = (this->prims).items;
    if (pPVar8 != (PrimRef *)0x0) {
      root.ptr = sVar20 << 5;
      if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar20 != 0) {
      pMVar9 = (prims->alloc).device;
      root.ptr = sVar20 * -0x20;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,root.ptr,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  BVHN<4>::cleanup(*ppBVar25,(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(*ppBVar25,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          prims.clear();
          bvh->clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::QBVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif
            /* create primref array */
            prims.resize(numPrimitives);
            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* call BVH builder */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::QuantizedNode)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            NodeRef root = BVHNBuilderQuantizedVirtual<N>::build(&bvh->alloc,CreateLeafQuantized<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            //bvh->layoutLargeNodes(pinfo.size()*0.005f); // FIXME: COPY LAYOUT FOR LARGE NODES !!!
#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }